

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_230;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string *local_f8;
  string *test_snippet;
  string shader_source;
  size_t string_index;
  string *local_c0;
  string local_b8 [8];
  string input [3];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string array_declaration;
  TestShaderType tested_shader_type_local;
  ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  array_declaration.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"    int x[1][1][1][1];\n\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  string_index._4_1_ = 1;
  local_c0 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"    if (x[].length() != 2) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&string_index + 7));
  local_c0 = (string *)(input[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0].field_2._M_local_buf + 8),
             "    if (x[][].length() != 2)  {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&string_index + 6));
  local_c0 = (string *)(input[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[1].field_2._M_local_buf + 8),
             "    if (x[][][].length() != 2)  {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&string_index + 5));
  string_index._4_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 7));
  for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 3;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)&test_snippet);
    local_f8 = (string *)
               (&input[shader_source.field_2._8_8_ + -1].field_2._M_allocated_capacity + 1);
    switch(array_declaration.field_2._12_4_) {
    case 0:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_fragment_shader
                (&local_138,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      break;
    case 1:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_vertex_shader
                (&local_118,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      break;
    case 2:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_compute_shader
                (&local_158,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      break;
    case 3:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_geometry_shader
                (&local_178,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      break;
    case 4:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_ctrl_shader
                (&local_198,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      break;
    case 5:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_eval_shader
                (&local_1b8,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 array_declaration.field_2._12_4_,(string *)local_38,local_f8);
      std::__cxx11::string::operator=((string *)&test_snippet,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x10dd);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[8])(this,(ulong)(uint)array_declaration.field_2._12_4_,&test_snippet);
    std::__cxx11::string::~string((string *)&test_snippet);
  }
  local_230 = (string *)(input[2].field_2._M_local_buf + 8);
  do {
    local_230 = local_230 + -0x20;
    std::__cxx11::string::~string(local_230);
  } while (local_230 != local_b8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ExpressionsLength3<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration = "    int x[1][1][1][1];\n\n";
	std::string input[]			  = { "    if (x[].length() != 2) {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string		   shader_source;
		const std::string& test_snippet = input[string_index];

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			shader_source = this->prepare_vertex_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			shader_source = this->prepare_fragment_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			shader_source = this->prepare_compute_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			shader_source = this->prepare_geometry_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			shader_source = this->prepare_tess_ctrl_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			shader_source = this->prepare_tess_eval_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		default:
			TCU_FAIL("Unrecognized shader type.");
			break;
		} /* switch (tested_shader_type) */

		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}